

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToChar<wchar_t>(wchar_t value,iu_ostream *os)

{
  ostream *poVar1;
  string local_70;
  wchar_t local_4c [2];
  wchar_t str [2];
  string local_38;
  iu_ostream *local_18;
  iu_ostream *os_local;
  wchar_t value_local;
  
  local_18 = os;
  os_local._4_4_ = value;
  if (value == L'\0') {
    std::operator<<(os,"\\0");
  }
  else if (value < L' ') {
    poVar1 = std::operator<<(os,"0x");
    ToHexString<wchar_t>(&local_38,os_local._4_4_);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    local_4c[1] = 0;
    local_4c[0] = value;
    poVar1 = std::operator<<(os,"\'");
    ShowAnyCString<wchar_t>(&local_70,local_4c);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    std::operator<<(poVar1,"\'");
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}